

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Session::Session(Session *this)

{
  ostream *poVar1;
  logic_error *this_00;
  allocator local_49;
  string msg;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Session_0016a7e0;
  makeCommandLineParser();
  (this->m_unusedTokens).
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_unusedTokens).
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_unusedTokens).
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ConfigData::ConfigData(&this->m_configData);
  (this->m_config).m_p = (Config *)0x0;
  if (alreadyInstantiated != '\x01') {
    alreadyInstantiated = 1;
    return;
  }
  std::__cxx11::string::string
            ((string *)&msg,"Only one instance of Catch::Session can ever be used",&local_49);
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&msg);
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,(string *)&msg);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Session()
        : m_cli( makeCommandLineParser() ) {
            if( alreadyInstantiated ) {
                std::string msg = "Only one instance of Catch::Session can ever be used";
                Catch::cerr() << msg << std::endl;
                throw std::logic_error( msg );
            }
            alreadyInstantiated = true;
        }